

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,uchar splitChar)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int i;
  CBString local_48;
  
  iVar2 = (b->super_tagbstring).slen;
  iVar3 = 0;
  do {
    i = iVar3;
    if (iVar3 < iVar2) {
      do {
        uVar1 = CBString::character(b,i);
        if (uVar1 == splitChar) break;
        i = i + 1;
      } while (i < (b->super_tagbstring).slen);
      if (iVar3 <= i) goto LAB_00158f03;
    }
    else {
LAB_00158f03:
      CBString::CBString(&local_48,(b->super_tagbstring).data + iVar3,i - iVar3);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
      local_48._vptr_CBString = (_func_int **)&PTR__CBString_001a9850;
      if (local_48.super_tagbstring.data != (uchar *)0x0) {
        free(local_48.super_tagbstring.data);
      }
    }
    iVar3 = i + 1;
    iVar2 = (b->super_tagbstring).slen;
    if (iVar2 <= i) {
      return;
    }
  } while( true );
}

Assistant:

void CBStringList::split (const CBString& b, unsigned char splitChar) {
int p, i;

	p = 0;
	do {
		for (i = p; i < b.length (); i++) {
			if (b.character (i) == splitChar) break;
		}
		if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
		p = i + 1;
	} while (p <= b.length ());
}